

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkCheckConstraints(ARKodeMem ark_mem,int *constrfails,int *nflag)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  undefined4 *in_RDX;
  int *in_RSI;
  long in_RDI;
  double dVar4;
  N_Vector tmp;
  N_Vector mm;
  int constraintsPassed;
  undefined8 local_40;
  undefined4 local_4;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x280);
  uVar2 = *(undefined8 *)(in_RDI + 0x278);
  iVar3 = N_VConstrMask(*(undefined8 *)(in_RDI + 0x290),*(undefined8 *)(in_RDI + 0x248),uVar1);
  if (iVar3 == 0) {
    *(long *)(in_RDI + 0x350) = *(long *)(in_RDI + 0x350) + 1;
    *in_RSI = *in_RSI + 1;
    if (*in_RSI == *(int *)(in_RDI + 0x31c)) {
      local_4 = -0x13;
    }
    else if (*(int *)(in_RDI + 0x300) == 0) {
      if (*(double *)(in_RDI + 0x2c8) * 1.000001 < ABS(*(double *)(in_RDI + 0x2c0))) {
        N_VLinearSum(0,0xbff0000000000000,*(undefined8 *)(in_RDI + 0x250),
                     *(undefined8 *)(in_RDI + 0x248),uVar2);
        N_VProd(uVar1,uVar2,uVar2);
        dVar4 = (double)N_VMinQuotient(*(undefined8 *)(in_RDI + 0x250),uVar2);
        *(double *)(in_RDI + 0x2e8) = dVar4 * 0.9;
        if (*(double *)(in_RDI + 0x2e8) <= 0.1) {
          local_40 = 0x3fb999999999999a;
        }
        else {
          local_40 = *(undefined8 *)(in_RDI + 0x2e8);
        }
        *(undefined8 *)(in_RDI + 0x2e8) = local_40;
        *in_RDX = 7;
        local_4 = 10;
      }
      else {
        local_4 = -0x13;
      }
    }
    else {
      local_4 = -0x13;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkCheckConstraints(ARKodeMem ark_mem, int* constrfails, int* nflag)
{
  sunbooleantype constraintsPassed;
  N_Vector mm  = ark_mem->tempv4;
  N_Vector tmp = ark_mem->tempv3;

  /* Check constraints and get mask vector mm for where constraints failed */
  constraintsPassed = N_VConstrMask(ark_mem->constraints, ark_mem->ycur, mm);
  if (constraintsPassed) { return (ARK_SUCCESS); }

  /* Constraints not met */

  /* Update total fails and fails in current step */
  ark_mem->nconstrfails++;
  (*constrfails)++;

  /* Return with error if reached max fails in a step */
  if (*constrfails == ark_mem->maxconstrfails) { return (ARK_CONSTR_FAIL); }

  /* Return with error if using fixed step sizes */
  if (ark_mem->fixedstep) { return (ARK_CONSTR_FAIL); }

  /* Return with error if |h| == hmin */
  if (SUNRabs(ark_mem->h) <= ark_mem->hmin * ONEPSM)
  {
    return (ARK_CONSTR_FAIL);
  }

  /* Reduce h by computing eta = h'/h */
  N_VLinearSum(ONE, ark_mem->yn, -ONE, ark_mem->ycur, tmp);
  N_VProd(mm, tmp, tmp);
  ark_mem->eta = SUN_RCONST(0.9) * N_VMinQuotient(ark_mem->yn, tmp);
  ark_mem->eta = SUNMAX(ark_mem->eta, TENTH);

  /* Signal for Jacobian/preconditioner setup */
  *nflag = PREV_CONV_FAIL;

  /* Return to reattempt the step */
  return (CONSTR_RECVR);
}